

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathUtils.h
# Opt level: O0

uint32_t slang::clog2(uint64_t value)

{
  long lVar1;
  int iVar2;
  uint32_t local_20;
  uint32_t log;
  uint64_t value_local;
  
  if (value == 0) {
    value_local._4_4_ = 0;
  }
  else {
    lVar1 = 0x3f;
    if (value != 0) {
      for (; value >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    iVar2 = -((uint)lVar1 ^ 0x3f);
    local_20 = iVar2 + 0x3f;
    if (value != 1L << ((byte)local_20 & 0x3f)) {
      local_20 = iVar2 + 0x40;
    }
    value_local._4_4_ = local_20;
  }
  return value_local._4_4_;
}

Assistant:

inline uint32_t clog2(uint64_t value) {
#if defined(_MSC_VER)
    unsigned long index;
#    if defined(_M_IX86)
    if (value >> 32) {
        _BitScanReverse(&index, (unsigned long)(value >> 32));
        index += 32;
    }
    else if (!_BitScanReverse(&index, (unsigned long)value)) {
        return 0;
    }
#    else
    if (!_BitScanReverse64(&index, value))
        return 0;
#    endif
    return index + (value & (value - 1) ? 1 : 0);
#else
    if (value == 0)
        return 0;
    uint32_t log = sizeof(value) * CHAR_BIT - 1 - (uint32_t)__builtin_clzll(value);
    return (value - (1ULL << log)) ? log + 1 : log;
#endif
}